

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O1

void __thiscall Clasp::Asp::LogicProgram::transformExtended(LogicProgram *this)

{
  int *piVar1;
  RuleBuilder *this_00;
  bool bVar2;
  uint64 uVar3;
  Strategy s;
  uint uVar4;
  RuleTransform tm;
  Lit_t auxB;
  Atom_t aux;
  Rule r;
  Rule rAux2;
  RuleTransform local_100;
  size_type local_f4;
  Atom_t local_f0;
  Atom_t local_ec;
  Rule local_e8;
  LitSpan local_b0;
  Rule_t local_a0;
  Rule_t local_68;
  
  local_f4 = (this->atoms_).ebo_.size;
  RuleTransform::RuleTransform(&local_100,this);
  if ((this->extended_).ebo_.size != 0) {
    uVar4 = 0;
    do {
      Potassco::RuleBuilder::rule(&local_a0,(this->extended_).ebo_.buf[uVar4]);
      piVar1 = (int *)(&(this->super_ProgramBuilder).field_0x1c +
                      (ulong)local_a0.ht.val_ * 4 + (long)this->statsId_ * 0x14);
      *piVar1 = *piVar1 + -1;
      *(int *)(&this->field_0x44 + (ulong)local_a0.bt.val_ * 4 + (long)this->statsId_ * 0xc) =
           *(int *)(&this->field_0x44 + (ulong)local_a0.bt.val_ * 4 + (long)this->statsId_ * 0xc) +
           -1;
      if (((ulong)local_a0.bt.val_ == 0) ||
         ((local_a0.ht.val_ == Disjunctive && (local_a0.head.size < 2)))) {
        RuleTransform::transform(&local_100,&local_a0,strategy_default);
      }
      else {
        local_f0 = newAtom(this);
        local_e8.bt.val_ = local_a0.bt.val_;
        local_e8.field_3._16_8_ = local_a0.field_3._16_8_;
        local_e8.field_3.cond.first = local_a0.field_3.cond.first;
        local_e8.field_3.cond.size = local_a0.field_3.cond.size;
        local_e8._0_8_ = (ulong)(uint)local_a0._4_4_ << 0x20;
        local_e8.head.first = &local_ec;
        local_e8.head.size = 1;
        local_b0.first = (int *)&local_f0;
        local_b0.size = 1;
        local_ec = local_f0;
        Potassco::Rule_t::normal(&local_68,local_a0.ht,&local_a0.head,&local_b0);
        bVar2 = handleNatively(this,&local_e8);
        if (bVar2) {
          addRule(this,&local_e8);
        }
        else {
          s = strategy_default;
          if ((local_e8.ht.val_ == Disjunctive) && (local_e8.bt.val_ != Normal)) {
            s = strategy_no_aux;
            if ((local_e8.field_3.agg.bound != 1) &&
               (s = strategy_default, local_e8.field_3.cond.size < 7)) {
              uVar3 = choose((uint)local_e8.field_3.cond.size,local_e8.field_3.agg.bound);
              s = (Strategy)(uVar3 < 0x10);
            }
          }
          RuleTransform::transform(&local_100,&local_e8,s);
        }
        bVar2 = handleNatively(this,&local_68);
        if (bVar2) {
          addRule(this,&local_68);
        }
        else {
          RuleTransform::transform(&local_100,&local_68,strategy_default);
        }
      }
      this_00 = (this->extended_).ebo_.buf[uVar4];
      if (this_00 != (RuleBuilder *)0x0) {
        Potassco::RuleBuilder::~RuleBuilder(this_00);
        operator_delete(this_00);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (this->extended_).ebo_.size);
  }
  (this->extended_).ebo_.size = 0;
  *(size_type *)&this->field_0x60 =
       *(int *)&this->field_0x60 + ((this->atoms_).ebo_.size - local_f4);
  RuleTransform::~RuleTransform(&local_100);
  return;
}

Assistant:

void LogicProgram::transformExtended() {
	uint32 a = numAtoms();
	RuleTransform tm(*this);
	for (RuleList::size_type i = 0; i != extended_.size(); ++i) {
		Rule r = extended_[i]->rule();
		upStat(r.ht, -1);
		upStat(r.bt, -1);
		if (r.normal() || (r.ht == Head_t::Disjunctive && Potassco::size(r.head) < 2)) {
			tm.transform(r);
		}
		else {
			using Potassco::Lit_t;
			Atom_t aux = newAtom();
			Lit_t auxB = Potassco::lit(aux);
			Rule rAux1 = r; // aux :- body
			rAux1.ht   = Head_t::Disjunctive;
			rAux1.head = Potassco::toSpan(&aux, 1);
			Rule rAux2 = Rule::normal(r.ht, r.head, Potassco::toSpan(&auxB, 1));  // head :- auxB
			if (handleNatively(rAux1)) { addRule(rAux1); }
			else {
				RuleTransform::Strategy st = transformNoAux(rAux1) ? RuleTransform::strategy_no_aux : RuleTransform::strategy_default;
				tm.transform(rAux1, st);
			}
			if (handleNatively(rAux2)) { addRule(rAux2); }
			else                       { tm.transform(rAux2); }
		}
		delete extended_[i];
	}
	extended_.clear();
	incTrAux(numAtoms() - a);
}